

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::ShiftLeft(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  int32 iVar1;
  uint32 uVar2;
  
  iVar1 = ToInt32(aLeft);
  uVar2 = ToUInt32(aRight);
  return (Var)((ulong)(uint)(iVar1 << ((byte)uVar2 & 0x1f)) | 0x1000000000000);
}

Assistant:

Var TaggedInt::ShiftLeft(Var aLeft,Var aRight,ScriptContext* scriptContext)
    {
        //
        // Shifting an integer left will always remain an integer, but it may overflow the Int31
        // range. Therefore, we must call JavascriptNumber::ToVar() to check.
        //

        int nValue      = ToInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return JavascriptNumber::ToVar(nValue << (nShift & 0x1F),scriptContext);
    }